

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimCreator.cpp
# Opt level: O3

void __thiscall OpenMD::SimCreator::setGlobalIndex(SimCreator *this,SimInfo *info)

{
  _Base_ptr p_Var1;
  pointer ppCVar2;
  CutoffGroup *pCVar3;
  pointer ppAVar4;
  pointer ppRVar5;
  void *pvVar6;
  _Base_ptr *pp_Var7;
  _Base_ptr p_Var8;
  Molecule *pMVar9;
  pointer ppCVar10;
  pointer ppRVar11;
  long lVar12;
  pointer ppSVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  _Base_ptr p_Var21;
  _Base_ptr p_Var22;
  _Base_ptr p_Var23;
  pointer ppAVar24;
  StuntDouble *pSVar25;
  int iVar26;
  RigidBody *pRVar27;
  int iVar28;
  Atom *pAVar29;
  MoleculeIterator mi;
  vector<int,_std::allocator<int>_> nIOPerMol;
  vector<int,_std::allocator<int>_> globalMolMembership;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> IOIndexToIntegrableObject;
  vector<int,_std::allocator<int>_> startingIOIndexForMol;
  vector<int,_std::allocator<int>_> numIntegrableObjectsPerMol;
  vector<int,_std::allocator<int>_> globalGroupMembership;
  MoleculeIterator local_e8;
  allocator_type local_dd;
  int local_dc;
  _Rb_tree_header *local_d8;
  vector<int,_std::allocator<int>_> local_d0;
  vector<int,_std::allocator<int>_> local_b8;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> local_a0;
  vector<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> local_70;
  vector<int,_std::allocator<int>_> local_58;
  size_type local_40;
  value_type local_38;
  
  local_e8._M_node = (_Base_ptr)0x0;
  local_dc = info->nGlobalMols_;
  iVar15 = info->nGlobalAtoms_;
  local_40 = (size_type)iVar15;
  if (0 < local_dc) {
    p_Var1 = (info->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_d8 = &(info->molecules_)._M_t._M_impl.super__Rb_tree_header;
    iVar26 = 0;
    iVar20 = 0;
    iVar19 = 0;
    iVar18 = 0;
    iVar17 = 0;
    iVar16 = 0;
    iVar14 = 0;
    do {
      p_Var8 = &local_d8->_M_header;
      p_Var21 = p_Var1;
      if (p_Var1 == (_Base_ptr)0x0) {
LAB_001293c2:
        p_Var8 = (_Base_ptr)0x0;
      }
      else {
        do {
          p_Var23 = p_Var21 + 1;
          if (iVar26 <= (int)p_Var23->_M_color) {
            p_Var8 = p_Var21;
          }
          pp_Var7 = &p_Var21->_M_left;
          p_Var21 = pp_Var7[(int)p_Var23->_M_color < iVar26];
        } while (pp_Var7[(int)p_Var23->_M_color < iVar26] != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var8 == local_d8) || (iVar26 < (int)p_Var8[1]._M_color))
        goto LAB_001293c2;
        p_Var8 = p_Var8[1]._M_parent;
      }
      p_Var21 = p_Var8->_M_left;
      p_Var23 = p_Var8->_M_right;
      if ((p_Var21 != p_Var23) && (p_Var22 = *(_Base_ptr *)p_Var21, p_Var22 != (_Base_ptr)0x0)) {
        do {
          iVar28 = iVar14;
          p_Var21 = (_Base_ptr)&p_Var21->_M_parent;
          *(int *)&p_Var22[1]._M_parent = iVar28;
          if (p_Var21 == p_Var23) break;
          p_Var22 = *(_Base_ptr *)p_Var21;
          iVar14 = iVar28 + 1;
        } while (p_Var22 != (_Base_ptr)0x0);
        iVar14 = iVar28 + 1;
      }
      p_Var21 = p_Var8[4]._M_parent;
      p_Var23 = p_Var8[4]._M_left;
      if ((p_Var21 != p_Var23) && (p_Var22 = *(_Base_ptr *)p_Var21, p_Var22 != (_Base_ptr)0x0)) {
        do {
          iVar28 = iVar15;
          p_Var21 = (_Base_ptr)&p_Var21->_M_parent;
          *(int *)&p_Var22[1]._M_parent = iVar28;
          if (p_Var21 == p_Var23) break;
          p_Var22 = *(_Base_ptr *)p_Var21;
          iVar15 = iVar28 + 1;
        } while (p_Var22 != (_Base_ptr)0x0);
        iVar15 = iVar28 + 1;
      }
      p_Var21 = p_Var8[5]._M_right;
      p_Var23 = *(_Base_ptr *)(p_Var8 + 6);
      if ((p_Var21 != p_Var23) && (p_Var22 = *(_Base_ptr *)p_Var21, p_Var22 != (_Base_ptr)0x0)) {
        do {
          iVar28 = iVar16;
          p_Var21 = (_Base_ptr)&p_Var21->_M_parent;
          *(int *)&p_Var22[1]._M_parent = iVar28;
          if (p_Var21 == p_Var23) break;
          p_Var22 = *(_Base_ptr *)p_Var21;
          iVar16 = iVar28 + 1;
        } while (p_Var22 != (_Base_ptr)0x0);
        iVar16 = iVar28 + 1;
      }
      p_Var21 = p_Var8[1]._M_parent;
      p_Var23 = p_Var8[1]._M_left;
      if ((p_Var21 != p_Var23) && (p_Var22 = *(_Base_ptr *)p_Var21, p_Var22 != (_Base_ptr)0x0)) {
        do {
          iVar28 = iVar17;
          p_Var21 = (_Base_ptr)&p_Var21->_M_parent;
          *(int *)&p_Var22[1]._M_parent = iVar28;
          if (p_Var21 == p_Var23) break;
          p_Var22 = *(_Base_ptr *)p_Var21;
          iVar17 = iVar28 + 1;
        } while (p_Var22 != (_Base_ptr)0x0);
        iVar17 = iVar28 + 1;
      }
      p_Var21 = *(_Base_ptr *)(p_Var8 + 2);
      p_Var23 = p_Var8[2]._M_parent;
      if ((p_Var21 != p_Var23) && (p_Var22 = *(_Base_ptr *)p_Var21, p_Var22 != (_Base_ptr)0x0)) {
        do {
          iVar28 = iVar18;
          p_Var21 = (_Base_ptr)&p_Var21->_M_parent;
          *(int *)&p_Var22[1]._M_parent = iVar28;
          if (p_Var21 == p_Var23) break;
          p_Var22 = *(_Base_ptr *)p_Var21;
          iVar18 = iVar28 + 1;
        } while (p_Var22 != (_Base_ptr)0x0);
        iVar18 = iVar28 + 1;
      }
      p_Var21 = p_Var8[2]._M_right;
      p_Var23 = *(_Base_ptr *)(p_Var8 + 3);
      if ((p_Var21 != p_Var23) && (p_Var22 = *(_Base_ptr *)p_Var21, p_Var22 != (_Base_ptr)0x0)) {
        do {
          iVar28 = iVar19;
          p_Var21 = (_Base_ptr)&p_Var21->_M_parent;
          *(int *)&p_Var22[1]._M_parent = iVar28;
          if (p_Var21 == p_Var23) break;
          p_Var22 = *(_Base_ptr *)p_Var21;
          iVar19 = iVar28 + 1;
        } while (p_Var22 != (_Base_ptr)0x0);
        iVar19 = iVar28 + 1;
      }
      p_Var21 = p_Var8[3]._M_left;
      p_Var8 = p_Var8[3]._M_right;
      if ((p_Var21 != p_Var8) && (p_Var23 = *(_Base_ptr *)p_Var21, p_Var23 != (_Base_ptr)0x0)) {
        do {
          iVar28 = iVar20;
          p_Var21 = (_Base_ptr)&p_Var21->_M_parent;
          *(int *)&p_Var23[1]._M_parent = iVar28;
          if (p_Var21 == p_Var8) break;
          p_Var23 = *(_Base_ptr *)p_Var21;
          iVar20 = iVar28 + 1;
        } while (p_Var23 != (_Base_ptr)0x0);
        iVar20 = iVar28 + 1;
      }
      iVar26 = iVar26 + 1;
    } while (iVar26 != local_dc);
  }
  local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_58,local_40,(value_type_conflict2 *)&local_b8,(allocator_type *)&local_d0);
  pMVar9 = SimInfo::beginMolecule(info,&local_e8);
  while (pMVar9 != (Molecule *)0x0) {
    ppCVar10 = (pMVar9->cutoffGroups_).
               super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppCVar2 = (pMVar9->cutoffGroups_).
              super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppCVar10 != ppCVar2) {
      pCVar3 = *ppCVar10;
      while (pCVar3 != (CutoffGroup *)0x0) {
        ppAVar24 = (pCVar3->cutoffAtomList).
                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppAVar4 = (pCVar3->cutoffAtomList).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if ((ppAVar24 != ppAVar4) && (pAVar29 = *ppAVar24, pAVar29 != (Atom *)0x0)) {
          iVar15 = pCVar3->globalIndex;
          do {
            ppAVar24 = ppAVar24 + 1;
            local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[(pAVar29->super_StuntDouble).globalIndex_] = iVar15;
            if (ppAVar24 == ppAVar4) break;
            pAVar29 = *ppAVar24;
          } while (pAVar29 != (Atom *)0x0);
        }
        ppCVar10 = ppCVar10 + 1;
        if (ppCVar10 == ppCVar2) break;
        pCVar3 = *ppCVar10;
      }
    }
    pMVar9 = SimInfo::nextMolecule(info,&local_e8);
  }
  std::vector<int,_std::allocator<int>_>::operator=(&info->globalGroupMembership_,&local_58);
  local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_b8,(long)info->nGlobalRigidBodies_ + (long)info->nGlobalAtoms_,
             (value_type_conflict2 *)&local_d0,(allocator_type *)&local_70);
  pMVar9 = SimInfo::beginMolecule(info,&local_e8);
  do {
    if (pMVar9 == (Molecule *)0x0) {
      std::vector<int,_std::allocator<int>_>::operator=(&info->globalMolMembership_,&local_b8);
      local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_d0,(long)info->nGlobalMols_,(value_type_conflict2 *)&local_70,
                 (allocator_type *)&local_88);
      pMVar9 = SimInfo::beginMolecule(info,&local_e8);
      while (pMVar9 != (Molecule *)0x0) {
        *(int *)(CONCAT44(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + (long)pMVar9->globalIndex_ * 4)
             = (int)((ulong)((long)(pMVar9->integrableObjects_).
                                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pMVar9->integrableObjects_).
                                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
        pMVar9 = SimInfo::nextMolecule(info,&local_e8);
      }
      std::vector<int,_std::allocator<int>_>::vector(&local_70,&local_d0);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_88,(long)info->nGlobalMols_,(allocator_type *)&local_a0);
      if (0 < info->nGlobalMols_) {
        lVar12 = 0;
        iVar15 = 0;
        do {
          local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar12] = iVar15;
          iVar15 = iVar15 + *(int *)(CONCAT44(local_70.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              local_70.super__Vector_base<int,_std::allocator<int>_>
                                              ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                    lVar12 * 4);
          lVar12 = lVar12 + 1;
        } while (lVar12 < info->nGlobalMols_);
      }
      local_38 = (value_type)0x0;
      std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::vector
                (&local_a0,(long)info->nGlobalIntegrableObjects_,&local_38,&local_dd);
      pMVar9 = SimInfo::beginMolecule(info,&local_e8);
      do {
        if (pMVar9 == (Molecule *)0x0) {
          SimInfo::setIOIndexToIntegrableObject(info,&local_a0);
          if (local_a0.
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0.
                            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_a0.
                                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a0.
                                  super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          pvVar6 = (void *)CONCAT44(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_,
                                    local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_4_);
          if (pvVar6 != (void *)0x0) {
            operator_delete(pvVar6,(long)local_70.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pvVar6);
          }
          pvVar6 = (void *)CONCAT44(local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_,
                                    local_d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_4_);
          if (pvVar6 != (void *)0x0) {
            operator_delete(pvVar6,(long)local_d0.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pvVar6);
          }
          pvVar6 = (void *)CONCAT44(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_,
                                    local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_4_);
          if (pvVar6 != (void *)0x0) {
            operator_delete(pvVar6,(long)local_b8.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pvVar6);
          }
          if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          return;
        }
        ppSVar13 = (pMVar9->integrableObjects_).
                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if ((ppSVar13 !=
             (pMVar9->integrableObjects_).
             super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
             _M_impl.super__Vector_impl_data._M_finish) &&
           (pSVar25 = *ppSVar13, pSVar25 != (StuntDouble *)0x0)) {
          lVar12 = (long)local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[pMVar9->globalIndex_];
          do {
            ppSVar13 = ppSVar13 + 1;
            pSVar25->globalIntegrableObjectIndex_ = (int)lVar12;
            local_a0.
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar12] = pSVar25;
            if (ppSVar13 ==
                (pMVar9->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) break;
            lVar12 = lVar12 + 1;
            pSVar25 = *ppSVar13;
          } while (pSVar25 != (StuntDouble *)0x0);
        }
        pMVar9 = SimInfo::nextMolecule(info,&local_e8);
      } while( true );
    }
    ppAVar24 = (pMVar9->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppAVar4 = (pMVar9->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ppAVar24 != ppAVar4) && (pAVar29 = *ppAVar24, pAVar29 != (Atom *)0x0)) {
      iVar15 = pMVar9->globalIndex_;
      do {
        ppAVar24 = ppAVar24 + 1;
        *(int *)(CONCAT44(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) +
                (long)(pAVar29->super_StuntDouble).globalIndex_ * 4) = iVar15;
        if (ppAVar24 == ppAVar4) break;
        pAVar29 = *ppAVar24;
      } while (pAVar29 != (Atom *)0x0);
    }
    ppRVar11 = (pMVar9->rigidBodies_).
               super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppRVar5 = (pMVar9->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ppRVar11 != ppRVar5) && (pRVar27 = *ppRVar11, pRVar27 != (RigidBody *)0x0)) {
      iVar15 = pMVar9->globalIndex_;
      do {
        ppRVar11 = ppRVar11 + 1;
        *(int *)(CONCAT44(local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) +
                (long)(pRVar27->super_StuntDouble).globalIndex_ * 4) = iVar15;
        if (ppRVar11 == ppRVar5) break;
        pRVar27 = *ppRVar11;
      } while (pRVar27 != (RigidBody *)0x0);
    }
    pMVar9 = SimInfo::nextMolecule(info,&local_e8);
  } while( true );
}

Assistant:

void SimCreator::setGlobalIndex(SimInfo* info) {
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator ri;
    Molecule::CutoffGroupIterator ci;
    Molecule::BondIterator boi;
    Molecule::BendIterator bei;
    Molecule::TorsionIterator ti;
    Molecule::InversionIterator ii;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    CutoffGroup* cg;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;
    int beginAtomIndex;
    int beginRigidBodyIndex;
    int beginCutoffGroupIndex;
    int beginBondIndex;
    int beginBendIndex;
    int beginTorsionIndex;
    int beginInversionIndex;
#ifdef IS_MPI
    int nGlobalAtoms       = info->getNGlobalAtoms();
    int nGlobalRigidBodies = info->getNGlobalRigidBodies();
#endif

    beginAtomIndex = 0;
    // The rigid body indices begin immediately after the atom indices:
    beginRigidBodyIndex   = info->getNGlobalAtoms();
    beginCutoffGroupIndex = 0;
    beginBondIndex        = 0;
    beginBendIndex        = 0;
    beginTorsionIndex     = 0;
    beginInversionIndex   = 0;

    for (int i = 0; i < info->getNGlobalMolecules(); i++) {
#ifdef IS_MPI
      if (info->getMolToProc(i) == worldRank) {
#endif
        // stuff to do if I own this molecule
        mol = info->getMoleculeByGlobalIndex(i);

        // The local index(index in DataStorge) of the atom is important:
        for (atom = mol->beginAtom(ai); atom != NULL;
             atom = mol->nextAtom(ai)) {
          atom->setGlobalIndex(beginAtomIndex++);
        }

        for (rb = mol->beginRigidBody(ri); rb != NULL;
             rb = mol->nextRigidBody(ri)) {
          rb->setGlobalIndex(beginRigidBodyIndex++);
        }

        // The local index of other objects only depends on the order
        // of traversal:
        for (cg = mol->beginCutoffGroup(ci); cg != NULL;
             cg = mol->nextCutoffGroup(ci)) {
          cg->setGlobalIndex(beginCutoffGroupIndex++);
        }
        for (bond = mol->beginBond(boi); bond != NULL;
             bond = mol->nextBond(boi)) {
          bond->setGlobalIndex(beginBondIndex++);
        }
        for (bend = mol->beginBend(bei); bend != NULL;
             bend = mol->nextBend(bei)) {
          bend->setGlobalIndex(beginBendIndex++);
        }
        for (torsion = mol->beginTorsion(ti); torsion != NULL;
             torsion = mol->nextTorsion(ti)) {
          torsion->setGlobalIndex(beginTorsionIndex++);
        }
        for (inversion = mol->beginInversion(ii); inversion != NULL;
             inversion = mol->nextInversion(ii)) {
          inversion->setGlobalIndex(beginInversionIndex++);
        }

#ifdef IS_MPI
      } else {
        // stuff to do if I don't own this molecule

        int stampId          = info->getMoleculeStampId(i);
        MoleculeStamp* stamp = info->getMoleculeStamp(stampId);

        beginAtomIndex += stamp->getNAtoms();
        beginRigidBodyIndex += stamp->getNRigidBodies();
        beginCutoffGroupIndex +=
            stamp->getNCutoffGroups() + stamp->getNFreeAtoms();
        beginBondIndex += stamp->getNBonds();
        beginBendIndex += stamp->getNBends();
        beginTorsionIndex += stamp->getNTorsions();
        beginInversionIndex += stamp->getNInversions();
      }
#endif

    }  // end for(int i=0)

    // fill globalGroupMembership
    std::vector<int> globalGroupMembership(info->getNGlobalAtoms(), 0);
    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      for (cg = mol->beginCutoffGroup(ci); cg != NULL;
           cg = mol->nextCutoffGroup(ci)) {
        for (atom = cg->beginAtom(ai); atom != NULL; atom = cg->nextAtom(ai)) {
          globalGroupMembership[atom->getGlobalIndex()] = cg->getGlobalIndex();
        }
      }
    }

#ifdef IS_MPI
    // Since the globalGroupMembership has been zero filled and we've only
    // poked values into the atoms we know, we can do an Allreduce
    // to get the full globalGroupMembership array (We think).
    // This would be prettier if we could use MPI_IN_PLACE like the MPI-2
    // docs said we could.
    std::vector<int> tmpGroupMembership(info->getNGlobalAtoms(), 0);
    MPI_Allreduce(&globalGroupMembership[0], &tmpGroupMembership[0],
                  nGlobalAtoms, MPI_INT, MPI_SUM, MPI_COMM_WORLD);

    info->setGlobalGroupMembership(tmpGroupMembership);
#else
    info->setGlobalGroupMembership(globalGroupMembership);
#endif

    // fill molMembership
    std::vector<int> globalMolMembership(
        info->getNGlobalAtoms() + info->getNGlobalRigidBodies(), 0);

    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        globalMolMembership[atom->getGlobalIndex()] = mol->getGlobalIndex();
      }
      for (rb = mol->beginRigidBody(ri); rb != NULL;
           rb = mol->nextRigidBody(ri)) {
        globalMolMembership[rb->getGlobalIndex()] = mol->getGlobalIndex();
      }
    }

#ifdef IS_MPI
    std::vector<int> tmpMolMembership(
        info->getNGlobalAtoms() + info->getNGlobalRigidBodies(), 0);
    MPI_Allreduce(&globalMolMembership[0], &tmpMolMembership[0],
                  nGlobalAtoms + nGlobalRigidBodies, MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);

    info->setGlobalMolMembership(tmpMolMembership);
#else
    info->setGlobalMolMembership(globalMolMembership);
#endif

    // nIOPerMol holds the number of integrable objects per molecule
    // here the molecules are listed by their global indices.

    std::vector<int> nIOPerMol(info->getNGlobalMolecules(), 0);
    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      nIOPerMol[mol->getGlobalIndex()] = mol->getNIntegrableObjects();
    }

#ifdef IS_MPI
    std::vector<int> numIntegrableObjectsPerMol(info->getNGlobalMolecules(), 0);
    MPI_Allreduce(&nIOPerMol[0], &numIntegrableObjectsPerMol[0],
                  info->getNGlobalMolecules(), MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);
#else
    std::vector<int> numIntegrableObjectsPerMol = nIOPerMol;
#endif

    std::vector<int> startingIOIndexForMol(info->getNGlobalMolecules());

    int startingIndex = 0;
    for (int i = 0; i < info->getNGlobalMolecules(); i++) {
      startingIOIndexForMol[i] = startingIndex;
      startingIndex += numIntegrableObjectsPerMol[i];
    }

    std::vector<StuntDouble*> IOIndexToIntegrableObject(
        info->getNGlobalIntegrableObjects(), (StuntDouble*)NULL);
    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      int myGlobalIndex = mol->getGlobalIndex();
      int globalIO      = startingIOIndexForMol[myGlobalIndex];
      for (StuntDouble* sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd              = mol->nextIntegrableObject(ioi)) {
        sd->setGlobalIntegrableObjectIndex(globalIO);
        IOIndexToIntegrableObject[globalIO] = sd;
        globalIO++;
      }
    }

    info->setIOIndexToIntegrableObject(IOIndexToIntegrableObject);
  }